

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::_PathArcToFastEx
          (ImDrawList *this,ImVec2 *center,float radius,int a_min_sample,int a_max_sample,int a_step
          )

{
  float fVar1;
  ImVec2 *pIVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ImVec2 *pIVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int a;
  uint uVar12;
  
  if (0.5 <= radius) {
    if (a_step < 1) {
      uVar5 = _CalcCircleAutoSegmentCount(this,radius);
      a_step = (int)(0x30 / (ulong)uVar5);
    }
    uVar5 = 0xc;
    if ((uint)a_step < 0xc) {
      uVar5 = a_step;
    }
    uVar12 = 1;
    uVar11 = uVar5;
    if (a_step == 0) {
      uVar11 = 1;
    }
    uVar9 = a_max_sample - a_min_sample;
    uVar3 = -uVar9;
    if (0 < (int)uVar9) {
      uVar3 = uVar9;
    }
    if (uVar11 < 2) {
      iVar6 = uVar3 + 1;
      bVar4 = false;
    }
    else {
      bVar4 = false;
      if ((int)((ulong)uVar3 % (ulong)uVar11) == 0) {
        iVar6 = uVar3 / uVar11 + 1;
        uVar12 = uVar5;
      }
      else {
        iVar6 = uVar3 / uVar11 + 2;
        bVar4 = true;
        uVar12 = (int)(char)-((char)((char)uVar11 - (char)((ulong)uVar3 % (ulong)uVar11)) / '\x02')
                 + uVar11;
      }
    }
    iVar8 = (this->_Path).Size;
    iVar6 = iVar6 + iVar8;
    iVar10 = (this->_Path).Capacity;
    if (iVar10 < iVar6) {
      if (iVar10 == 0) {
        iVar10 = 8;
      }
      else {
        iVar10 = iVar10 / 2 + iVar10;
      }
      if (iVar10 <= iVar6) {
        iVar10 = iVar6;
      }
      pIVar7 = (ImVec2 *)ImGui::MemAlloc((long)iVar10 << 3);
      pIVar2 = (this->_Path).Data;
      if (pIVar2 != (ImVec2 *)0x0) {
        memcpy(pIVar7,pIVar2,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar7;
      (this->_Path).Capacity = iVar10;
    }
    else {
      pIVar7 = (this->_Path).Data;
    }
    (this->_Path).Size = iVar6;
    iVar6 = a_min_sample;
    if (0x2f < (uint)a_min_sample) {
      iVar6 = ((uint)(a_min_sample / 6 + (a_min_sample >> 0x1f)) >> 3) - (a_min_sample >> 0x1f);
      iVar10 = a_min_sample + iVar6 * -0x30;
      iVar6 = a_min_sample + 0x30 + iVar6 * -0x30;
      if (-1 < iVar10) {
        iVar6 = iVar10;
      }
    }
    pIVar7 = pIVar7 + iVar8;
    if (a_max_sample < a_min_sample) {
      do {
        iVar8 = iVar6 + 0x30;
        if (-1 < iVar6) {
          iVar8 = iVar6;
        }
        fVar1 = this->_Data->ArcFastVtx[iVar8].y;
        pIVar7->x = this->_Data->ArcFastVtx[iVar8].x * radius + center->x;
        pIVar7->y = fVar1 * radius + center->y;
        pIVar7 = pIVar7 + 1;
        a_min_sample = a_min_sample - uVar12;
        iVar6 = iVar8 - uVar12;
        uVar12 = uVar11;
      } while (a_max_sample <= a_min_sample);
    }
    else {
      do {
        iVar8 = iVar6 + -0x30;
        if (iVar6 < 0x30) {
          iVar8 = iVar6;
        }
        fVar1 = this->_Data->ArcFastVtx[iVar8].y;
        pIVar7->x = this->_Data->ArcFastVtx[iVar8].x * radius + center->x;
        pIVar7->y = fVar1 * radius + center->y;
        pIVar7 = pIVar7 + 1;
        a_min_sample = a_min_sample + uVar12;
        iVar6 = iVar8 + uVar12;
        uVar12 = uVar11;
      } while (a_min_sample <= a_max_sample);
    }
    if (bVar4) {
      iVar6 = ((uint)(a_max_sample / 6 + (a_max_sample >> 0x1f)) >> 3) - (a_max_sample >> 0x1f);
      uVar11 = a_max_sample + iVar6 * -0x30;
      uVar5 = a_max_sample + 0x30 + iVar6 * -0x30;
      if (-1 < (int)uVar11) {
        uVar5 = uVar11;
      }
      fVar1 = this->_Data->ArcFastVtx[uVar5].y;
      pIVar7->x = this->_Data->ArcFastVtx[uVar5].x * radius + center->x;
      pIVar7->y = radius * fVar1 + center->y;
    }
  }
  else {
    iVar6 = (this->_Path).Size;
    if (iVar6 == (this->_Path).Capacity) {
      if (iVar6 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar6 / 2 + iVar6;
      }
      iVar10 = iVar6 + 1;
      if (iVar6 + 1 < iVar8) {
        iVar10 = iVar8;
      }
      pIVar7 = (ImVec2 *)ImGui::MemAlloc((long)iVar10 << 3);
      pIVar2 = (this->_Path).Data;
      if (pIVar2 != (ImVec2 *)0x0) {
        memcpy(pIVar7,pIVar2,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar7;
      (this->_Path).Capacity = iVar10;
      iVar6 = (this->_Path).Size;
    }
    else {
      pIVar7 = (this->_Path).Data;
    }
    pIVar7[iVar6] = *center;
    (this->_Path).Size = (this->_Path).Size + 1;
  }
  return;
}

Assistant:

void ImDrawList::_PathArcToFastEx(const ImVec2& center, float radius, int a_min_sample, int a_max_sample, int a_step)
{
    if (radius < 0.5f)
    {
        _Path.push_back(center);
        return;
    }

    // Calculate arc auto segment step size
    if (a_step <= 0)
        a_step = IM_DRAWLIST_ARCFAST_SAMPLE_MAX / _CalcCircleAutoSegmentCount(radius);

    // Make sure we never do steps larger than one quarter of the circle
    a_step = ImClamp(a_step, 1, IM_DRAWLIST_ARCFAST_TABLE_SIZE / 4);

    const int sample_range = ImAbs(a_max_sample - a_min_sample);
    const int a_next_step = a_step;

    int samples = sample_range + 1;
    bool extra_max_sample = false;
    if (a_step > 1)
    {
        samples            = sample_range / a_step + 1;
        const int overstep = sample_range % a_step;

        if (overstep > 0)
        {
            extra_max_sample = true;
            samples++;

            // When we have overstep to avoid awkwardly looking one long line and one tiny one at the end,
            // distribute first step range evenly between them by reducing first step size.
            if (sample_range > 0)
                a_step -= (a_step - overstep) / 2;
        }
    }

    _Path.resize(_Path.Size + samples);
    ImVec2* out_ptr = _Path.Data + (_Path.Size - samples);

    int sample_index = a_min_sample;
    if (sample_index < 0 || sample_index >= IM_DRAWLIST_ARCFAST_SAMPLE_MAX)
    {
        sample_index = sample_index % IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        if (sample_index < 0)
            sample_index += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
    }

    if (a_max_sample >= a_min_sample)
    {
        for (int a = a_min_sample; a <= a_max_sample; a += a_step, sample_index += a_step, a_step = a_next_step)
        {
            // a_step is clamped to IM_DRAWLIST_ARCFAST_SAMPLE_MAX, so we have guaranteed that it will not wrap over range twice or more
            if (sample_index >= IM_DRAWLIST_ARCFAST_SAMPLE_MAX)
                sample_index -= IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

            const ImVec2 s = _Data->ArcFastVtx[sample_index];
            out_ptr->x = center.x + s.x * radius;
            out_ptr->y = center.y + s.y * radius;
            out_ptr++;
        }
    }
    else
    {
        for (int a = a_min_sample; a >= a_max_sample; a -= a_step, sample_index -= a_step, a_step = a_next_step)
        {
            // a_step is clamped to IM_DRAWLIST_ARCFAST_SAMPLE_MAX, so we have guaranteed that it will not wrap over range twice or more
            if (sample_index < 0)
                sample_index += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

            const ImVec2 s = _Data->ArcFastVtx[sample_index];
            out_ptr->x = center.x + s.x * radius;
            out_ptr->y = center.y + s.y * radius;
            out_ptr++;
        }
    }

    if (extra_max_sample)
    {
        int normalized_max_sample = a_max_sample % IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        if (normalized_max_sample < 0)
            normalized_max_sample += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

        const ImVec2 s = _Data->ArcFastVtx[normalized_max_sample];
        out_ptr->x = center.x + s.x * radius;
        out_ptr->y = center.y + s.y * radius;
        out_ptr++;
    }

    IM_ASSERT_PARANOID(_Path.Data + _Path.Size == out_ptr);
}